

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crange.cpp
# Opt level: O0

short CRange::init_switch(string *switchfile)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  dictionary *d_00;
  ostream *poVar4;
  dictionary *d;
  short sswitch;
  string *switchfile_local;
  
  d._6_2_ = 0x28;
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0) {
    switchfile_local._6_2_ = 0x28;
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = access(pcVar3,4);
    if (iVar1 == 0) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      d_00 = iniparser_load(pcVar3);
      iVar1 = iniparser_getboolean(d_00,"switch:barkas",0);
      d._6_2_ = (ushort)(iVar1 != 0);
      iVar1 = iniparser_getboolean(d_00,"switch:shell",0);
      if (iVar1 != 0) {
        d._6_2_ = d._6_2_ | 2;
      }
      iVar1 = iniparser_getboolean(d_00,"switch:leung",0);
      if (iVar1 != 0) {
        d._6_2_ = d._6_2_ | 4;
      }
      iVar1 = iniparser_getboolean(d_00,"switch:new delta",1);
      if (iVar1 != 0) {
        d._6_2_ = d._6_2_ | 8;
      }
      iVar1 = iniparser_getboolean(d_00,"switch:new electron capture",0);
      if (iVar1 != 0) {
        d._6_2_ = d._6_2_ | 0x10;
      }
      iVar1 = iniparser_getboolean(d_00,"switch:finite nuclear size",1);
      if (iVar1 != 0) {
        d._6_2_ = d._6_2_ | 0x20;
      }
      iVar1 = iniparser_getboolean(d_00,"switch:kinematic",0);
      if (iVar1 != 0) {
        d._6_2_ = d._6_2_ | 0x40;
      }
      iVar1 = iniparser_getboolean(d_00,"switch:radiative",0);
      if (iVar1 != 0) {
        d._6_2_ = d._6_2_ | 0x80;
      }
      iVar1 = iniparser_getboolean(d_00,"switch:pair",0);
      if (iVar1 != 0) {
        d._6_2_ = d._6_2_ | 0x100;
      }
      iVar1 = iniparser_getboolean(d_00,"switch:bremsstrahlung",0);
      if (iVar1 != 0) {
        d._6_2_ = d._6_2_ | 0x200;
      }
      iniparser_freedict(d_00);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Could not read switch file: ");
      poVar4 = std::operator<<(poVar4,(string *)switchfile);
      poVar4 = std::operator<<(poVar4,". Using default crange switches.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    switchfile_local._6_2_ = d._6_2_;
  }
  return switchfile_local._6_2_;
}

Assistant:

short CRange::init_switch( const std::string &switchfile )
{
    short sswitch = SSWITCH_DEFAULT;
    if (switchfile.length() == 0) return sswitch;
    if (access(switchfile.c_str(), R_OK) == 0) {
        sswitch = 0;
        dictionary *d = iniparser_load( switchfile.c_str() );
        if (iniparser_getboolean(d,"switch:barkas",0)) sswitch |= SSWITCH_BA;
        if (iniparser_getboolean(d,"switch:shell",0))  sswitch |= SSWITCH_SH;
        if (iniparser_getboolean(d,"switch:leung",0))  sswitch |= SSWITCH_LE;
        if (iniparser_getboolean(d,"switch:new delta",1))  sswitch |= SSWITCH_ND; // True by default!
        if (iniparser_getboolean(d,"switch:new electron capture",0))  sswitch |= SSWITCH_EC;
        if (iniparser_getboolean(d,"switch:finite nuclear size",1))  sswitch |= SSWITCH_NS; // True by default!
        if (iniparser_getboolean(d,"switch:kinematic",0))  sswitch |= SSWITCH_KI;
        if (iniparser_getboolean(d,"switch:radiative",0))  sswitch |= SSWITCH_RA;
        if (iniparser_getboolean(d,"switch:pair",0))  sswitch |= SSWITCH_PA;
        if (iniparser_getboolean(d,"switch:bremsstrahlung",0))  sswitch |= SSWITCH_BR;
        iniparser_freedict(d);
    } else {
        std::cerr << "Could not read switch file: " << switchfile
                  << ". Using default crange switches." << std::endl;
    }
    return sswitch;
}